

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PopStyleVar(int count)

{
  int iVar1;
  ImGuiStyleMod *pIVar2;
  ImGuiContext *pIVar3;
  ulong uVar4;
  
  pIVar3 = GImGui;
  for (; 0 < count; count = count + -1) {
    pIVar2 = (pIVar3->StyleVarStack).Data;
    iVar1 = (pIVar3->StyleVarStack).Size;
    uVar4 = (ulong)GStyleVarInfo[pIVar2[(long)iVar1 + -1].VarIdx].Offset;
    if (GStyleVarInfo[pIVar2[(long)iVar1 + -1].VarIdx].Count == 2) {
      *(int *)((long)&(pIVar3->Style).Alpha + uVar4) = pIVar2[(long)iVar1 + -1].field_1.BackupInt[0]
      ;
      *(int *)((long)&(pIVar3->Style).WindowPadding.x + uVar4) =
           pIVar2[(long)iVar1 + -1].field_1.BackupInt[1];
    }
    else if (GStyleVarInfo[pIVar2[(long)iVar1 + -1].VarIdx].Count == 1) {
      *(int *)((long)&(pIVar3->Style).Alpha + uVar4) = pIVar2[(long)iVar1 + -1].field_1.BackupInt[0]
      ;
    }
    (pIVar3->StyleVarStack).Size = iVar1 + -1;
  }
  return;
}

Assistant:

void ImGui::PopStyleVar(int count)
{
    ImGuiContext& g = *GImGui;
    while (count > 0)
    {
        // We avoid a generic memcpy(data, &backup.Backup.., GDataTypeSize[info->Type] * info->Count), the overhead in Debug is not worth it.
        ImGuiStyleMod& backup = g.StyleVarStack.back();
        const ImGuiStyleVarInfo* info = GetStyleVarInfo(backup.VarIdx);
        void* data = info->GetVarPtr(&g.Style);
        if (info->Type == ImGuiDataType_Float && info->Count == 1)      { ((float*)data)[0] = backup.BackupFloat[0]; }
        else if (info->Type == ImGuiDataType_Float && info->Count == 2) { ((float*)data)[0] = backup.BackupFloat[0]; ((float*)data)[1] = backup.BackupFloat[1]; }
        g.StyleVarStack.pop_back();
        count--;
    }
}